

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

optional<bool> __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
::
remove_or_choose_subtree<std::optional<bool>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::optimistic_lock::read_critical_section&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>**,unodb::optimistic_lock::read_critical_section*,unodb::node_type*,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>*>
          (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
           *this,node_type type,byte *args,basic_art_key<unsigned_long> *args_1,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *args_2,
          read_critical_section *args_3,read_critical_section *args_4,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **args_5,in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                   ***args_6,read_critical_section **args_7,node_type **args_8,
          basic_node_ptr<unodb::detail::olc_node_header> **args_9)

{
  _Optional_base<bool,_true,_true> _Var1;
  undefined7 in_register_00000031;
  
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    remove_or_choose_subtree<std::optional<bool>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::optimistic_lock::read_critical_section&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>**,unodb::optimistic_lock::read_critical_section*,unodb::node_type*,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>*>
              ();
  default:
    remove_or_choose_subtree<std::optional<bool>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::optimistic_lock::read_critical_section&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>**,unodb::optimistic_lock::read_critical_section*,unodb::node_type*,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>*>
              ();
  case 1:
    _Var1._M_payload.super__Optional_payload_base<bool> =
         (_Optional_payload<bool,_true,_true,_true>)
         olc_impl_helpers::
         remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                   ((olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)this,*args,
                    *(basic_art_key<unsigned_long> *)(args_1->field_0).key_bytes._M_elems,args_2,
                    args_3,args_4,*args_5,*args_6,*args_7,*args_8,*args_9);
    break;
  case 2:
    _Var1._M_payload.super__Optional_payload_base<bool> =
         (_Optional_payload<bool,_true,_true,_true>)
         olc_impl_helpers::
         remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                   ((olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)this,*args,
                    *(basic_art_key<unsigned_long> *)(args_1->field_0).key_bytes._M_elems,args_2,
                    args_3,args_4,*args_5,*args_6,*args_7,*args_8,*args_9);
    break;
  case 3:
    _Var1._M_payload.super__Optional_payload_base<bool> =
         (_Optional_payload<bool,_true,_true,_true>)
         olc_impl_helpers::
         remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                   ((olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)this,*args,
                    *(basic_art_key<unsigned_long> *)(args_1->field_0).key_bytes._M_elems,args_2,
                    args_3,args_4,*args_5,*args_6,*args_7,*args_8,*args_9);
    break;
  case 4:
    _Var1._M_payload.super__Optional_payload_base<bool> =
         (_Optional_payload<bool,_true,_true,_true>)
         olc_impl_helpers::
         remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                   ((olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)this,*args,
                    *(basic_art_key<unsigned_long> *)(args_1->field_0).key_bytes._M_elems,args_2,
                    args_3,args_4,*args_5,*args_6,*args_7,*args_8,*args_9);
  }
  return (_Optional_base<bool,_true,_true>)
         (_Optional_base<bool,_true,_true>)_Var1._M_payload.super__Optional_payload_base<bool>;
}

Assistant:

[[nodiscard]] ReturnType remove_or_choose_subtree(node_type type,
                                                    Args &&...args) {
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }